

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O2

int uarb_set(uarb result,png_alloc_size_t val)

{
  int ndigits;
  long lVar1;
  
  lVar1 = 0;
  for (; val != 0; val = val >> 0x10) {
    result[lVar1] = (png_uint_16)val;
    lVar1 = lVar1 + 1;
  }
  return (int)lVar1;
}

Assistant:

static int
uarb_set(uarb result, png_alloc_size_t val)
   /* Set (initialize) 'result' to 'val'.  The size required for 'result' must
    * be determined by the caller from a knowledge of the maximum for 'val'.
    */
{
   int ndigits = 0;

   while (val > 0)
   {
      result[ndigits++] = (png_uint_16)(val & 0xffff);
      val >>= 16;
   }

   return ndigits;
}